

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_2d_avx2.h
# Opt level: O1

void convolve_2d_sr_hor_6tap_avx2
               (uint8_t *src,int32_t src_stride,int32_t w,int32_t h,
               InterpFilterParams *filter_params_x,int32_t subpel_x_q4,int16_t *im_block)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long lVar4;
  undefined1 (*pauVar5) [16];
  undefined1 (*pauVar6) [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  __m128i coeffs_1;
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  
  pauVar5 = (undefined1 (*) [16])(src + -2);
  auVar9 = vpsraw_avx(*(undefined1 (*) [16])
                       (filter_params_x->filter_ptr +
                       (uint)filter_params_x->taps * (subpel_x_q4 & 0xfU)),1);
  if (w < 5) {
    auVar1 = vpshufb_avx(auVar9,_DAT_00569040);
    auVar2 = vpshufb_avx(auVar9,_DAT_00569050);
    auVar9 = vpshufb_avx(auVar9,_DAT_00569060);
    if (w == 2) {
      lVar4 = 0;
      auVar29._8_2_ = 2;
      auVar29._0_8_ = 0x2000200020002;
      auVar29._10_2_ = 2;
      auVar29._12_2_ = 2;
      auVar29._14_2_ = 2;
      do {
        auVar30._8_8_ = 0;
        auVar30._0_8_ = *(ulong *)*pauVar5;
        auVar30 = vmovhps_avx(auVar30,*(undefined8 *)(*pauVar5 + src_stride));
        auVar22 = vpshufb_avx(auVar30,ZEXT816(0xa09090802010100));
        auVar28 = vpshufb_avx(auVar30,ZEXT816(0xc0b0b0a04030302));
        auVar3 = vpshufb_avx(auVar30,ZEXT816(0xe0d0d0c06050504));
        auVar30 = vpmaddubsw_avx(auVar22,auVar1);
        auVar22 = vpmaddubsw_avx(auVar28,auVar2);
        auVar30 = vpaddw_avx(auVar30,auVar22);
        auVar22 = vpmaddubsw_avx(auVar3,auVar9);
        auVar22 = vpaddw_avx(auVar22,auVar29);
        auVar30 = vpaddw_avx(auVar30,auVar22);
        auVar30 = vpsraw_avx(auVar30,2);
        *(long *)(im_block + lVar4 * 2) = auVar30._0_8_;
        pauVar5 = (undefined1 (*) [16])(*pauVar5 + src_stride * 2);
        lVar4 = lVar4 + 2;
      } while (h != (int)lVar4);
    }
    else if (w == 4) {
      lVar4 = 0;
      auVar22._8_2_ = 2;
      auVar22._0_8_ = 0x2000200020002;
      auVar22._10_2_ = 2;
      auVar22._12_2_ = 2;
      auVar22._14_2_ = 2;
      do {
        auVar28._8_8_ = 0;
        auVar28._0_8_ = *(ulong *)*pauVar5;
        auVar29 = vmovhps_avx(auVar28,*(undefined8 *)(*pauVar5 + src_stride));
        auVar30 = vpshufb_avx(auVar29,ZEXT816(0xa09090802010100));
        auVar28 = vpshufb_avx(auVar29,ZEXT816(0xc0b0b0a04030302));
        auVar3 = vpshufb_avx(auVar29,ZEXT816(0xe0d0d0c06050504));
        auVar29 = vpmaddubsw_avx(auVar30,auVar1);
        auVar30 = vpmaddubsw_avx(auVar28,auVar2);
        auVar29 = vpaddw_avx(auVar29,auVar30);
        auVar30 = vpmaddubsw_avx(auVar3,auVar9);
        auVar30 = vpaddw_avx(auVar30,auVar22);
        auVar29 = vpaddw_avx(auVar29,auVar30);
        auVar29 = vpsraw_avx(auVar29,2);
        *(undefined1 (*) [16])(im_block + lVar4 * 4) = auVar29;
        pauVar5 = (undefined1 (*) [16])(*pauVar5 + src_stride * 2);
        lVar4 = lVar4 + 2;
      } while (h != (int)lVar4);
    }
  }
  else {
    auVar1 = vpshufb_avx(auVar9,_DAT_0056b160);
    auVar7._0_2_ = auVar1._0_2_;
    auVar7._2_2_ = auVar7._0_2_;
    auVar7._4_2_ = auVar7._0_2_;
    auVar7._6_2_ = auVar7._0_2_;
    auVar7._8_2_ = auVar7._0_2_;
    auVar7._10_2_ = auVar7._0_2_;
    auVar7._12_2_ = auVar7._0_2_;
    auVar7._14_2_ = auVar7._0_2_;
    auVar7._16_2_ = auVar7._0_2_;
    auVar7._18_2_ = auVar7._0_2_;
    auVar7._20_2_ = auVar7._0_2_;
    auVar7._22_2_ = auVar7._0_2_;
    auVar7._24_2_ = auVar7._0_2_;
    auVar7._26_2_ = auVar7._0_2_;
    auVar7._28_2_ = auVar7._0_2_;
    auVar7._30_2_ = auVar7._0_2_;
    auVar1 = vpshufb_avx(auVar9,_DAT_0056b170);
    auVar8._0_2_ = auVar1._0_2_;
    auVar8._2_2_ = auVar8._0_2_;
    auVar8._4_2_ = auVar8._0_2_;
    auVar8._6_2_ = auVar8._0_2_;
    auVar8._8_2_ = auVar8._0_2_;
    auVar8._10_2_ = auVar8._0_2_;
    auVar8._12_2_ = auVar8._0_2_;
    auVar8._14_2_ = auVar8._0_2_;
    auVar8._16_2_ = auVar8._0_2_;
    auVar8._18_2_ = auVar8._0_2_;
    auVar8._20_2_ = auVar8._0_2_;
    auVar8._22_2_ = auVar8._0_2_;
    auVar8._24_2_ = auVar8._0_2_;
    auVar8._26_2_ = auVar8._0_2_;
    auVar8._28_2_ = auVar8._0_2_;
    auVar8._30_2_ = auVar8._0_2_;
    auVar9 = vpshufb_avx(auVar9,_DAT_0056b180);
    auVar10._0_2_ = auVar9._0_2_;
    auVar10._2_2_ = auVar10._0_2_;
    auVar10._4_2_ = auVar10._0_2_;
    auVar10._6_2_ = auVar10._0_2_;
    auVar10._8_2_ = auVar10._0_2_;
    auVar10._10_2_ = auVar10._0_2_;
    auVar10._12_2_ = auVar10._0_2_;
    auVar10._14_2_ = auVar10._0_2_;
    auVar10._16_2_ = auVar10._0_2_;
    auVar10._18_2_ = auVar10._0_2_;
    auVar10._20_2_ = auVar10._0_2_;
    auVar10._22_2_ = auVar10._0_2_;
    auVar10._24_2_ = auVar10._0_2_;
    auVar10._26_2_ = auVar10._0_2_;
    auVar10._28_2_ = auVar10._0_2_;
    auVar10._30_2_ = auVar10._0_2_;
    switch(w << 0x1d | w - 8U >> 3) {
    case 0:
      auVar11._16_16_ = _DAT_00516d60;
      auVar11._0_16_ = _DAT_00516d60;
      auVar14._16_16_ = _DAT_00516940;
      auVar14._0_16_ = _DAT_00516940;
      auVar19._16_16_ = _DAT_00516950;
      auVar19._0_16_ = _DAT_00516950;
      auVar23._8_2_ = 2;
      auVar23._0_8_ = 0x2000200020002;
      auVar23._10_2_ = 2;
      auVar23._12_2_ = 2;
      auVar23._14_2_ = 2;
      auVar23._16_2_ = 2;
      auVar23._18_2_ = 2;
      auVar23._20_2_ = 2;
      auVar23._22_2_ = 2;
      auVar23._24_2_ = 2;
      auVar23._26_2_ = 2;
      auVar23._28_2_ = 2;
      auVar23._30_2_ = 2;
      do {
        auVar31._0_16_ =
             ZEXT116(0) * *(undefined1 (*) [16])(*pauVar5 + src_stride) + ZEXT116(1) * *pauVar5;
        auVar31._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
             ZEXT116(1) * *(undefined1 (*) [16])(*pauVar5 + src_stride);
        auVar37 = vpshufb_avx2(auVar31,auVar11);
        auVar17 = vpshufb_avx2(auVar31,auVar14);
        auVar34 = vpshufb_avx2(auVar31,auVar19);
        auVar37 = vpmaddubsw_avx2(auVar37,auVar7);
        auVar17 = vpmaddubsw_avx2(auVar17,auVar8);
        auVar37 = vpaddw_avx2(auVar37,auVar17);
        auVar17 = vpmaddubsw_avx2(auVar34,auVar10);
        auVar17 = vpaddw_avx2(auVar17,auVar23);
        auVar37 = vpaddw_avx2(auVar37,auVar17);
        auVar37 = vpsraw_avx2(auVar37,2);
        *(undefined1 (*) [32])im_block = auVar37;
        pauVar5 = (undefined1 (*) [16])(*pauVar5 + src_stride * 2);
        im_block = (int16_t *)((long)im_block + 0x20);
        h = h + -2;
      } while (h != 0);
      break;
    case 1:
      pauVar5 = (undefined1 (*) [16])(src + 6);
      auVar12._16_16_ = _DAT_00516d60;
      auVar12._0_16_ = _DAT_00516d60;
      auVar16._16_16_ = _DAT_00516940;
      auVar16._0_16_ = _DAT_00516940;
      auVar20._16_16_ = _DAT_00516950;
      auVar20._0_16_ = _DAT_00516950;
      auVar25._8_2_ = 2;
      auVar25._0_8_ = 0x2000200020002;
      auVar25._10_2_ = 2;
      auVar25._12_2_ = 2;
      auVar25._14_2_ = 2;
      auVar25._16_2_ = 2;
      auVar25._18_2_ = 2;
      auVar25._20_2_ = 2;
      auVar25._22_2_ = 2;
      auVar25._24_2_ = 2;
      auVar25._26_2_ = 2;
      auVar25._28_2_ = 2;
      auVar25._30_2_ = 2;
      do {
        auVar32._0_16_ =
             ZEXT116(0) * *(undefined1 (*) [16])(pauVar5[-1] + (long)src_stride + 8) +
             ZEXT116(1) * *(undefined1 (*) [16])(pauVar5[-1] + 8);
        auVar32._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
             ZEXT116(1) * *(undefined1 (*) [16])(pauVar5[-1] + (long)src_stride + 8);
        auVar37 = vpshufb_avx2(auVar32,auVar12);
        auVar17 = vpshufb_avx2(auVar32,auVar16);
        auVar34 = vpshufb_avx2(auVar32,auVar20);
        auVar37 = vpmaddubsw_avx2(auVar37,auVar7);
        auVar17 = vpmaddubsw_avx2(auVar17,auVar8);
        auVar37 = vpaddw_avx2(auVar37,auVar17);
        auVar34 = vpmaddubsw_avx2(auVar34,auVar10);
        auVar35._0_16_ =
             ZEXT116(0) * *(undefined1 (*) [16])(*pauVar5 + src_stride) + ZEXT116(1) * *pauVar5;
        auVar35._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
             ZEXT116(1) * *(undefined1 (*) [16])(*pauVar5 + src_stride);
        auVar17 = vpshufb_avx2(auVar35,auVar12);
        auVar26 = vpshufb_avx2(auVar35,auVar16);
        auVar36 = vpshufb_avx2(auVar35,auVar20);
        auVar17 = vpmaddubsw_avx2(auVar17,auVar7);
        auVar26 = vpmaddubsw_avx2(auVar26,auVar8);
        auVar17 = vpaddw_avx2(auVar17,auVar26);
        auVar26 = vpmaddubsw_avx2(auVar36,auVar10);
        auVar34 = vpaddw_avx2(auVar34,auVar25);
        auVar37 = vpaddw_avx2(auVar37,auVar34);
        auVar34 = vpaddw_avx2(auVar26,auVar25);
        auVar17 = vpaddw_avx2(auVar17,auVar34);
        auVar38._0_16_ = ZEXT116(0) * auVar17._0_16_ + ZEXT116(1) * auVar37._0_16_;
        auVar38._16_16_ = ZEXT116(0) * auVar37._16_16_ + ZEXT116(1) * auVar17._0_16_;
        auVar34 = vpsraw_avx2(auVar38,2);
        auVar37 = vperm2i128_avx2(auVar37,auVar17,0x31);
        auVar37 = vpsraw_avx2(auVar37,2);
        *(undefined1 (*) [32])im_block = auVar34;
        *(undefined1 (*) [32])((long)im_block + 0x20) = auVar37;
        im_block = (int16_t *)((long)im_block + 0x40);
        pauVar5 = (undefined1 (*) [16])(*pauVar5 + src_stride * 2);
        h = h + -2;
      } while (h != 0);
      break;
    default:
      pauVar6 = (undefined1 (*) [32])(src + 0x66);
      auVar13._16_16_ = _DAT_00516d60;
      auVar13._0_16_ = _DAT_00516d60;
      auVar18._16_16_ = _DAT_00516940;
      auVar18._0_16_ = _DAT_00516940;
      auVar21._16_16_ = _DAT_00516950;
      auVar21._0_16_ = _DAT_00516950;
      auVar27._8_2_ = 2;
      auVar27._0_8_ = 0x2000200020002;
      auVar27._10_2_ = 2;
      auVar27._12_2_ = 2;
      auVar27._14_2_ = 2;
      auVar27._16_2_ = 2;
      auVar27._18_2_ = 2;
      auVar27._20_2_ = 2;
      auVar27._22_2_ = 2;
      auVar27._24_2_ = 2;
      auVar27._26_2_ = 2;
      auVar27._28_2_ = 2;
      auVar27._30_2_ = 2;
      do {
        auVar37 = *(undefined1 (*) [32])(pauVar6[-4] + 0x18);
        auVar17 = pauVar6[-3];
        auVar34 = vpshufb_avx2(auVar37,auVar13);
        auVar26 = vpshufb_avx2(auVar37,auVar18);
        auVar36 = vpshufb_avx2(auVar37,auVar21);
        auVar37 = vpmaddubsw_avx2(auVar34,auVar7);
        auVar34 = vpmaddubsw_avx2(auVar26,auVar8);
        auVar37 = vpaddw_avx2(auVar37,auVar34);
        auVar34 = vpmaddubsw_avx2(auVar36,auVar10);
        auVar26 = vpshufb_avx2(auVar17,auVar13);
        auVar36 = vpshufb_avx2(auVar17,auVar18);
        auVar15 = vpshufb_avx2(auVar17,auVar21);
        auVar17 = vpmaddubsw_avx2(auVar26,auVar7);
        auVar26 = vpmaddubsw_avx2(auVar36,auVar8);
        auVar17 = vpaddw_avx2(auVar17,auVar26);
        auVar26 = vpmaddubsw_avx2(auVar15,auVar10);
        auVar34 = vpaddw_avx2(auVar34,auVar27);
        auVar37 = vpaddw_avx2(auVar37,auVar34);
        auVar34 = vpsraw_avx2(auVar37,2);
        auVar37 = vpaddw_avx2(auVar26,auVar27);
        auVar37 = vpaddw_avx2(auVar17,auVar37);
        auVar37 = vpsraw_avx2(auVar37,2);
        *(undefined1 (*) [32])im_block = auVar34;
        *(undefined1 (*) [32])((long)im_block + 0x20) = auVar37;
        auVar37 = *(undefined1 (*) [32])(pauVar6[-3] + 0x18);
        auVar17 = pauVar6[-2];
        auVar34 = vpshufb_avx2(auVar37,auVar13);
        auVar26 = vpshufb_avx2(auVar37,auVar18);
        auVar36 = vpshufb_avx2(auVar37,auVar21);
        auVar37 = vpmaddubsw_avx2(auVar34,auVar7);
        auVar34 = vpmaddubsw_avx2(auVar26,auVar8);
        auVar37 = vpaddw_avx2(auVar37,auVar34);
        auVar34 = vpmaddubsw_avx2(auVar36,auVar10);
        auVar26 = vpshufb_avx2(auVar17,auVar13);
        auVar36 = vpshufb_avx2(auVar17,auVar18);
        auVar15 = vpshufb_avx2(auVar17,auVar21);
        auVar17 = vpmaddubsw_avx2(auVar26,auVar7);
        auVar26 = vpmaddubsw_avx2(auVar36,auVar8);
        auVar17 = vpaddw_avx2(auVar17,auVar26);
        auVar26 = vpmaddubsw_avx2(auVar15,auVar10);
        auVar34 = vpaddw_avx2(auVar34,auVar27);
        auVar37 = vpaddw_avx2(auVar37,auVar34);
        auVar34 = vpsraw_avx2(auVar37,2);
        auVar37 = vpaddw_avx2(auVar26,auVar27);
        auVar37 = vpaddw_avx2(auVar17,auVar37);
        auVar37 = vpsraw_avx2(auVar37,2);
        *(undefined1 (*) [32])((long)im_block + 0x40) = auVar34;
        *(undefined1 (*) [32])((long)im_block + 0x60) = auVar37;
        auVar37 = *(undefined1 (*) [32])(pauVar6[-2] + 0x18);
        auVar17 = pauVar6[-1];
        auVar34 = vpshufb_avx2(auVar37,auVar13);
        auVar26 = vpshufb_avx2(auVar37,auVar18);
        auVar36 = vpshufb_avx2(auVar37,auVar21);
        auVar37 = vpmaddubsw_avx2(auVar34,auVar7);
        auVar34 = vpmaddubsw_avx2(auVar26,auVar8);
        auVar37 = vpaddw_avx2(auVar37,auVar34);
        auVar34 = vpmaddubsw_avx2(auVar36,auVar10);
        auVar26 = vpshufb_avx2(auVar17,auVar13);
        auVar36 = vpshufb_avx2(auVar17,auVar18);
        auVar15 = vpshufb_avx2(auVar17,auVar21);
        auVar17 = vpmaddubsw_avx2(auVar26,auVar7);
        auVar26 = vpmaddubsw_avx2(auVar36,auVar8);
        auVar17 = vpaddw_avx2(auVar17,auVar26);
        auVar26 = vpmaddubsw_avx2(auVar15,auVar10);
        auVar34 = vpaddw_avx2(auVar34,auVar27);
        auVar37 = vpaddw_avx2(auVar37,auVar34);
        auVar34 = vpsraw_avx2(auVar37,2);
        auVar37 = vpaddw_avx2(auVar26,auVar27);
        auVar37 = vpaddw_avx2(auVar17,auVar37);
        auVar37 = vpsraw_avx2(auVar37,2);
        *(undefined1 (*) [32])((long)im_block + 0x80) = auVar34;
        *(undefined1 (*) [32])((long)im_block + 0xa0) = auVar37;
        auVar37 = *(undefined1 (*) [32])(pauVar6[-1] + 0x18);
        auVar17 = *pauVar6;
        auVar34 = vpshufb_avx2(auVar37,auVar13);
        auVar26 = vpshufb_avx2(auVar37,auVar18);
        auVar36 = vpshufb_avx2(auVar37,auVar21);
        auVar37 = vpmaddubsw_avx2(auVar34,auVar7);
        auVar34 = vpmaddubsw_avx2(auVar26,auVar8);
        auVar37 = vpaddw_avx2(auVar37,auVar34);
        auVar34 = vpmaddubsw_avx2(auVar36,auVar10);
        auVar26 = vpshufb_avx2(auVar17,auVar13);
        auVar36 = vpshufb_avx2(auVar17,auVar18);
        auVar15 = vpshufb_avx2(auVar17,auVar21);
        auVar17 = vpmaddubsw_avx2(auVar26,auVar7);
        auVar26 = vpmaddubsw_avx2(auVar36,auVar8);
        auVar17 = vpaddw_avx2(auVar17,auVar26);
        auVar26 = vpmaddubsw_avx2(auVar15,auVar10);
        auVar34 = vpaddw_avx2(auVar34,auVar27);
        auVar37 = vpaddw_avx2(auVar37,auVar34);
        auVar34 = vpsraw_avx2(auVar37,2);
        auVar37 = vpaddw_avx2(auVar26,auVar27);
        auVar37 = vpaddw_avx2(auVar17,auVar37);
        auVar37 = vpsraw_avx2(auVar37,2);
        *(undefined1 (*) [32])((long)im_block + 0xc0) = auVar34;
        *(undefined1 (*) [32])((long)im_block + 0xe0) = auVar37;
        im_block = (int16_t *)((long)im_block + 0x100);
        pauVar6 = (undefined1 (*) [32])(*pauVar6 + src_stride);
        h = h + -1;
      } while (h != 0);
      break;
    case 3:
      pauVar6 = (undefined1 (*) [32])(src + 6);
      auVar36._16_16_ = _DAT_00516d60;
      auVar36._0_16_ = _DAT_00516d60;
      auVar15._16_16_ = _DAT_00516940;
      auVar15._0_16_ = _DAT_00516940;
      auVar33._16_16_ = _DAT_00516950;
      auVar33._0_16_ = _DAT_00516950;
      auVar24._8_2_ = 2;
      auVar24._0_8_ = 0x2000200020002;
      auVar24._10_2_ = 2;
      auVar24._12_2_ = 2;
      auVar24._14_2_ = 2;
      auVar24._16_2_ = 2;
      auVar24._18_2_ = 2;
      auVar24._20_2_ = 2;
      auVar24._22_2_ = 2;
      auVar24._24_2_ = 2;
      auVar24._26_2_ = 2;
      auVar24._28_2_ = 2;
      auVar24._30_2_ = 2;
      do {
        auVar37 = *(undefined1 (*) [32])(pauVar6[-1] + 0x18);
        auVar17 = *pauVar6;
        auVar34 = vpshufb_avx2(auVar37,auVar36);
        auVar26 = vpshufb_avx2(auVar37,auVar15);
        auVar13 = vpshufb_avx2(auVar37,auVar33);
        auVar37 = vpmaddubsw_avx2(auVar34,auVar7);
        auVar34 = vpmaddubsw_avx2(auVar26,auVar8);
        auVar37 = vpaddw_avx2(auVar37,auVar34);
        auVar34 = vpmaddubsw_avx2(auVar13,auVar10);
        auVar26 = vpshufb_avx2(auVar17,auVar36);
        auVar13 = vpshufb_avx2(auVar17,auVar15);
        auVar18 = vpshufb_avx2(auVar17,auVar33);
        auVar17 = vpmaddubsw_avx2(auVar26,auVar7);
        auVar26 = vpmaddubsw_avx2(auVar13,auVar8);
        auVar17 = vpaddw_avx2(auVar17,auVar26);
        auVar26 = vpmaddubsw_avx2(auVar18,auVar10);
        auVar34 = vpaddw_avx2(auVar34,auVar24);
        auVar37 = vpaddw_avx2(auVar37,auVar34);
        auVar34 = vpsraw_avx2(auVar37,2);
        auVar37 = vpaddw_avx2(auVar26,auVar24);
        auVar37 = vpaddw_avx2(auVar17,auVar37);
        auVar37 = vpsraw_avx2(auVar37,2);
        *(undefined1 (*) [32])im_block = auVar34;
        *(undefined1 (*) [32])((long)im_block + 0x20) = auVar37;
        im_block = (int16_t *)((long)im_block + 0x40);
        pauVar6 = (undefined1 (*) [32])(*pauVar6 + src_stride);
        h = h + -1;
      } while (h != 0);
      break;
    case 7:
      pauVar6 = (undefined1 (*) [32])(src + 0x26);
      auVar37._16_16_ = _DAT_00516d60;
      auVar37._0_16_ = _DAT_00516d60;
      auVar17._16_16_ = _DAT_00516940;
      auVar17._0_16_ = _DAT_00516940;
      auVar34._16_16_ = _DAT_00516950;
      auVar34._0_16_ = _DAT_00516950;
      auVar26._8_2_ = 2;
      auVar26._0_8_ = 0x2000200020002;
      auVar26._10_2_ = 2;
      auVar26._12_2_ = 2;
      auVar26._14_2_ = 2;
      auVar26._16_2_ = 2;
      auVar26._18_2_ = 2;
      auVar26._20_2_ = 2;
      auVar26._22_2_ = 2;
      auVar26._24_2_ = 2;
      auVar26._26_2_ = 2;
      auVar26._28_2_ = 2;
      auVar26._30_2_ = 2;
      do {
        auVar36 = *(undefined1 (*) [32])(pauVar6[-2] + 0x18);
        auVar15 = pauVar6[-1];
        auVar33 = vpshufb_avx2(auVar36,auVar37);
        auVar24 = vpshufb_avx2(auVar36,auVar17);
        auVar13 = vpshufb_avx2(auVar36,auVar34);
        auVar36 = vpmaddubsw_avx2(auVar33,auVar7);
        auVar33 = vpmaddubsw_avx2(auVar24,auVar8);
        auVar36 = vpaddw_avx2(auVar36,auVar33);
        auVar33 = vpmaddubsw_avx2(auVar13,auVar10);
        auVar24 = vpshufb_avx2(auVar15,auVar37);
        auVar13 = vpshufb_avx2(auVar15,auVar17);
        auVar18 = vpshufb_avx2(auVar15,auVar34);
        auVar15 = vpmaddubsw_avx2(auVar24,auVar7);
        auVar24 = vpmaddubsw_avx2(auVar13,auVar8);
        auVar15 = vpaddw_avx2(auVar15,auVar24);
        auVar24 = vpmaddubsw_avx2(auVar18,auVar10);
        auVar33 = vpaddw_avx2(auVar33,auVar26);
        auVar36 = vpaddw_avx2(auVar36,auVar33);
        auVar33 = vpsraw_avx2(auVar36,2);
        auVar36 = vpaddw_avx2(auVar24,auVar26);
        auVar36 = vpaddw_avx2(auVar15,auVar36);
        auVar36 = vpsraw_avx2(auVar36,2);
        *(undefined1 (*) [32])im_block = auVar33;
        *(undefined1 (*) [32])((long)im_block + 0x20) = auVar36;
        auVar36 = *(undefined1 (*) [32])(pauVar6[-1] + 0x18);
        auVar15 = *pauVar6;
        auVar33 = vpshufb_avx2(auVar36,auVar37);
        auVar24 = vpshufb_avx2(auVar36,auVar17);
        auVar13 = vpshufb_avx2(auVar36,auVar34);
        auVar36 = vpmaddubsw_avx2(auVar33,auVar7);
        auVar33 = vpmaddubsw_avx2(auVar24,auVar8);
        auVar36 = vpaddw_avx2(auVar36,auVar33);
        auVar33 = vpmaddubsw_avx2(auVar13,auVar10);
        auVar24 = vpshufb_avx2(auVar15,auVar37);
        auVar13 = vpshufb_avx2(auVar15,auVar17);
        auVar18 = vpshufb_avx2(auVar15,auVar34);
        auVar15 = vpmaddubsw_avx2(auVar24,auVar7);
        auVar24 = vpmaddubsw_avx2(auVar13,auVar8);
        auVar15 = vpaddw_avx2(auVar15,auVar24);
        auVar24 = vpmaddubsw_avx2(auVar18,auVar10);
        auVar33 = vpaddw_avx2(auVar33,auVar26);
        auVar36 = vpaddw_avx2(auVar36,auVar33);
        auVar33 = vpsraw_avx2(auVar36,2);
        auVar36 = vpaddw_avx2(auVar24,auVar26);
        auVar36 = vpaddw_avx2(auVar15,auVar36);
        auVar36 = vpsraw_avx2(auVar36,2);
        *(undefined1 (*) [32])((long)im_block + 0x40) = auVar33;
        *(undefined1 (*) [32])((long)im_block + 0x60) = auVar36;
        im_block = (int16_t *)((long)im_block + 0x80);
        pauVar6 = (undefined1 (*) [32])(*pauVar6 + src_stride);
        h = h + -1;
      } while (h != 0);
    }
  }
  return;
}

Assistant:

static void convolve_2d_sr_hor_6tap_avx2(
    const uint8_t *const src, const int32_t src_stride, const int32_t w,
    const int32_t h, const InterpFilterParams *const filter_params_x,
    const int32_t subpel_x_q4, int16_t *const im_block) {
  const uint8_t *src_ptr = src - 2;
  int32_t y = h;
  int16_t *im = im_block;

  if (w <= 4) {
    __m128i coeffs_128[3];

    prepare_half_coeffs_6tap_ssse3(filter_params_x, subpel_x_q4, coeffs_128);
    if (w == 2) {
      do {
        const __m128i r =
            x_convolve_6tap_2x2_ssse3(src_ptr, src_stride, coeffs_128);
        xy_x_round_store_2x2_sse2(r, im);
        src_ptr += 2 * src_stride;
        im += 2 * 2;
        y -= 2;
      } while (y);
    } else if (w == 4) {
      do {
        const __m128i r =
            x_convolve_6tap_4x2_ssse3(src_ptr, src_stride, coeffs_128);
        xy_x_round_store_4x2_sse2(r, im);
        src_ptr += 2 * src_stride;
        im += 2 * 4;
        y -= 2;
      } while (y);
    }
  } else {
    __m256i coeffs_256[3], filt_256[3];

    filt_256[0] = _mm256_loadu_si256((__m256i const *)filt1_global_avx2);
    filt_256[1] = _mm256_loadu_si256((__m256i const *)filt2_global_avx2);
    filt_256[2] = _mm256_loadu_si256((__m256i const *)filt3_global_avx2);

    prepare_half_coeffs_6tap_avx2(filter_params_x, subpel_x_q4, coeffs_256);

    if (w == 8) {
      do {
        const __m256i res =
            x_convolve_6tap_8x2_avx2(src_ptr, src_stride, coeffs_256, filt_256);
        xy_x_round_store_8x2_avx2(res, im);

        src_ptr += 2 * src_stride;
        im += 2 * 8;
        y -= 2;
      } while (y);
    } else if (w == 16) {
      do {
        __m256i r[2];

        x_convolve_6tap_16x2_avx2(src_ptr, src_stride, coeffs_256, filt_256, r);
        xy_x_round_store_32_avx2(r, im);
        src_ptr += 2 * src_stride;
        im += 2 * 16;
        y -= 2;
      } while (y);
    } else if (w == 32) {
      do {
        xy_x_6tap_32_avx2(src_ptr, coeffs_256, filt_256, im);
        src_ptr += src_stride;
        im += 32;
      } while (--y);
    } else if (w == 64) {
      do {
        xy_x_6tap_32_avx2(src_ptr, coeffs_256, filt_256, im);
        xy_x_6tap_32_avx2(src_ptr + 32, coeffs_256, filt_256, im + 32);
        src_ptr += src_stride;
        im += 64;
      } while (--y);
    } else {
      assert(w == 128);

      do {
        xy_x_6tap_32_avx2(src_ptr, coeffs_256, filt_256, im);
        xy_x_6tap_32_avx2(src_ptr + 32, coeffs_256, filt_256, im + 32);
        xy_x_6tap_32_avx2(src_ptr + 64, coeffs_256, filt_256, im + 64);
        xy_x_6tap_32_avx2(src_ptr + 96, coeffs_256, filt_256, im + 96);
        src_ptr += src_stride;
        im += 128;
      } while (--y);
    }
  }
}